

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall kj::ArrayBuilder<int>::~ArrayBuilder(ArrayBuilder<int> *this)

{
  int *piVar1;
  RemoveConst<int> *pRVar2;
  int *piVar3;
  
  piVar1 = this->ptr;
  if (piVar1 != (int *)0x0) {
    pRVar2 = this->pos;
    piVar3 = this->endPtr;
    this->ptr = (int *)0x0;
    this->pos = (RemoveConst<int> *)0x0;
    this->endPtr = (int *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,piVar1,4,(long)pRVar2 - (long)piVar1 >> 2,
               (long)piVar3 - (long)piVar1 >> 2,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }